

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_shard.c
# Opt level: O0

REF_STATUS ref_shard_split(REF_SHARD ref_shard)

{
  REF_GRID pRVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_CELL ref_cell_01;
  REF_CELL ref_cell_02;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_31;
  REF_STATUS ref_private_macro_code_rss_30;
  REF_STATUS ref_private_macro_code_rss_29;
  REF_STATUS ref_private_macro_code_rss_28;
  REF_STATUS ref_private_macro_code_rss_27;
  REF_STATUS ref_private_macro_code_rss_26;
  REF_STATUS ref_private_macro_code_rss_25;
  REF_STATUS ref_private_macro_code_rss_24;
  REF_STATUS ref_private_macro_code_rss_23;
  REF_STATUS ref_private_macro_code_rss_22;
  REF_STATUS ref_private_macro_code_rss_21;
  REF_STATUS ref_private_macro_code_rss_20;
  REF_STATUS ref_private_macro_code_rss_19;
  REF_STATUS ref_private_macro_code_rss_18;
  REF_STATUS ref_private_macro_code_rss_17;
  REF_STATUS ref_private_macro_code_rss_16;
  REF_STATUS ref_private_macro_code_rss_15;
  REF_STATUS ref_private_macro_code_rss_14;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL marked;
  REF_INT qua_nodes [5];
  REF_STATUS local_f8;
  REF_BOOL local_f4;
  REF_INT tri_nodes [4];
  REF_INT local_dc;
  REF_INT local_d8;
  REF_INT new_cell;
  REF_INT pri_nodes [6];
  REF_INT local_b8;
  REF_INT local_b4;
  REF_INT hex_nodes [27];
  int local_44;
  REF_INT cell;
  REF_CELL qua;
  REF_CELL tri;
  REF_CELL pri;
  REF_CELL hex;
  REF_GRID ref_grid;
  REF_SHARD ref_shard_local;
  
  pRVar1 = ref_shard->grid;
  ref_cell = pRVar1->cell[0xb];
  ref_cell_00 = pRVar1->cell[10];
  ref_cell_01 = pRVar1->cell[3];
  ref_cell_02 = pRVar1->cell[6];
  for (local_44 = 0; local_44 < ref_cell_02->max; local_44 = local_44 + 1) {
    RVar2 = ref_cell_nodes(ref_cell_02,local_44,&ref_private_macro_code_rss);
    if (RVar2 == 0) {
      uVar3 = ref_shard_marked(ref_shard,ref_private_macro_code_rss,qua_nodes[0],
                               &ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x11a,"ref_shard_split",(ulong)uVar3,"0-2");
        return uVar3;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        uVar3 = ref_cell_remove(ref_cell_02,local_44);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x11c,"ref_shard_split",(ulong)uVar3,"remove qua");
          return uVar3;
        }
        local_f8 = ref_private_macro_code_rss;
        local_f4 = marked;
        tri_nodes[0] = qua_nodes[0];
        tri_nodes[1] = qua_nodes[2];
        uVar3 = ref_cell_add(ref_cell_01,&local_f8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x121,"ref_shard_split",(ulong)uVar3,"add tri");
          return uVar3;
        }
        local_f8 = ref_private_macro_code_rss;
        local_f4 = qua_nodes[0];
        tri_nodes[0] = qua_nodes[1];
        tri_nodes[1] = qua_nodes[2];
        uVar3 = ref_cell_add(ref_cell_01,&local_f8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x126,"ref_shard_split",(ulong)uVar3,"add tri");
          return uVar3;
        }
      }
      uVar3 = ref_shard_marked(ref_shard,marked,qua_nodes[1],&ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x129,"ref_shard_split",(ulong)uVar3,"1-3");
        return uVar3;
      }
      if (ref_private_macro_code_rss_1 != 0) {
        uVar3 = ref_cell_remove(ref_cell_02,local_44);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 299,"ref_shard_split",(ulong)uVar3,"remove qua");
          return uVar3;
        }
        local_f8 = ref_private_macro_code_rss;
        local_f4 = marked;
        tri_nodes[0] = qua_nodes[1];
        tri_nodes[1] = qua_nodes[2];
        uVar3 = ref_cell_add(ref_cell_01,&local_f8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x130,"ref_shard_split",(ulong)uVar3,"add tri");
          return uVar3;
        }
        local_f8 = marked;
        local_f4 = qua_nodes[0];
        tri_nodes[0] = qua_nodes[1];
        tri_nodes[1] = qua_nodes[2];
        uVar3 = ref_cell_add(ref_cell_01,&local_f8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x135,"ref_shard_split",(ulong)uVar3,"add tri");
          return uVar3;
        }
      }
    }
  }
  local_44 = 0;
  do {
    if (ref_cell->max <= local_44) {
      return 0;
    }
    RVar2 = ref_cell_nodes(ref_cell,local_44,&local_b8);
    if (RVar2 == 0) {
      uVar3 = ref_shard_marked(ref_shard,local_b4,hex_nodes[2],&ref_private_macro_code_rss_1);
      if (uVar3 != 0) {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
               0x13b,"ref_shard_split",(ulong)uVar3,"1-4");
        return uVar3;
      }
      if (ref_private_macro_code_rss_1 == 0) {
        uVar3 = ref_shard_marked(ref_shard,local_b8,hex_nodes[3],&ref_private_macro_code_rss_1);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x14f,"ref_shard_split",(ulong)uVar3,"0-5");
          return uVar3;
        }
        if (ref_private_macro_code_rss_1 == 0) {
          uVar3 = ref_shard_marked(ref_shard,local_b4,hex_nodes[4],&ref_private_macro_code_rss_1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x164,"ref_shard_split",(ulong)uVar3,"1-6");
            return uVar3;
          }
          if (ref_private_macro_code_rss_1 == 0) {
            uVar3 = ref_shard_marked(ref_shard,hex_nodes[0],hex_nodes[3],
                                     &ref_private_macro_code_rss_1);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x178,"ref_shard_split",(ulong)uVar3,"2-5");
              return uVar3;
            }
            if (ref_private_macro_code_rss_1 == 0) {
              uVar3 = ref_shard_marked(ref_shard,local_b8,hex_nodes[0],&ref_private_macro_code_rss_1
                                      );
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x18d,"ref_shard_split",(ulong)uVar3,"0-2");
                return uVar3;
              }
              if (ref_private_macro_code_rss_1 == 0) {
                uVar3 = ref_shard_marked(ref_shard,local_b4,hex_nodes[1],
                                         &ref_private_macro_code_rss_1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x1a2,"ref_shard_split",(ulong)uVar3,"1-3");
                  return uVar3;
                }
                if (ref_private_macro_code_rss_1 != 0) {
                  uVar3 = ref_cell_remove(ref_cell,local_44);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1a4,"ref_shard_split",(ulong)uVar3,"remove hex");
                    return uVar3;
                  }
                  local_d8 = local_b8;
                  new_cell = local_b4;
                  pri_nodes[0] = hex_nodes[1];
                  pri_nodes[1] = hex_nodes[2];
                  pri_nodes[2] = hex_nodes[3];
                  pri_nodes[3] = hex_nodes[5];
                  uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1ab,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                    return uVar3;
                  }
                  local_d8 = local_b4;
                  new_cell = hex_nodes[0];
                  pri_nodes[0] = hex_nodes[1];
                  pri_nodes[1] = hex_nodes[3];
                  pri_nodes[2] = hex_nodes[4];
                  pri_nodes[3] = hex_nodes[5];
                  uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                           ,0x1b2,"ref_shard_split",(ulong)uVar3,"add hex_pri 2");
                    return uVar3;
                  }
                }
              }
              else {
                uVar3 = ref_cell_remove(ref_cell,local_44);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,399,"ref_shard_split",(ulong)uVar3,"remove hex");
                  return uVar3;
                }
                local_d8 = local_b8;
                new_cell = local_b4;
                pri_nodes[0] = hex_nodes[0];
                pri_nodes[1] = hex_nodes[2];
                pri_nodes[2] = hex_nodes[3];
                pri_nodes[3] = hex_nodes[4];
                uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x196,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                  return uVar3;
                }
                local_d8 = local_b8;
                new_cell = hex_nodes[0];
                pri_nodes[0] = hex_nodes[1];
                pri_nodes[1] = hex_nodes[2];
                pri_nodes[2] = hex_nodes[4];
                pri_nodes[3] = hex_nodes[5];
                uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                         ,0x19d,"ref_shard_split",(ulong)uVar3,"add hex_pri 2");
                  return uVar3;
                }
              }
            }
            else {
              uVar3 = ref_cell_remove(ref_cell,local_44);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x17a,"ref_shard_split",(ulong)uVar3,"remove hex");
                return uVar3;
              }
              local_d8 = local_b4;
              new_cell = hex_nodes[3];
              pri_nodes[0] = hex_nodes[0];
              pri_nodes[1] = local_b8;
              pri_nodes[2] = hex_nodes[2];
              pri_nodes[3] = hex_nodes[1];
              uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x181,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
                return uVar3;
              }
              local_d8 = hex_nodes[0];
              new_cell = hex_nodes[3];
              pri_nodes[0] = hex_nodes[4];
              pri_nodes[1] = hex_nodes[1];
              pri_nodes[2] = hex_nodes[2];
              pri_nodes[3] = hex_nodes[5];
              uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                       ,0x188,"ref_shard_split",(ulong)uVar3,"add hex pri 2");
                return uVar3;
              }
            }
          }
          else {
            uVar3 = ref_cell_remove(ref_cell,local_44);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x166,"ref_shard_split",(ulong)uVar3,"remove hex");
              return uVar3;
            }
            local_d8 = local_b4;
            new_cell = hex_nodes[3];
            pri_nodes[0] = hex_nodes[4];
            pri_nodes[1] = local_b8;
            pri_nodes[2] = hex_nodes[2];
            pri_nodes[3] = hex_nodes[5];
            uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x16d,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
              return uVar3;
            }
            local_d8 = local_b4;
            new_cell = hex_nodes[4];
            pri_nodes[0] = hex_nodes[0];
            pri_nodes[1] = local_b8;
            pri_nodes[2] = hex_nodes[5];
            pri_nodes[3] = hex_nodes[1];
            uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                     ,0x174,"ref_shard_split",(ulong)uVar3,"add hex_pri 2");
              return uVar3;
            }
          }
        }
        else {
          uVar3 = ref_cell_remove(ref_cell,local_44);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x151,"ref_shard_split",(ulong)uVar3,"remove hex");
            return uVar3;
          }
          local_d8 = local_b8;
          new_cell = hex_nodes[3];
          pri_nodes[0] = local_b4;
          pri_nodes[1] = hex_nodes[1];
          pri_nodes[2] = hex_nodes[4];
          pri_nodes[3] = hex_nodes[0];
          uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x158,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
            return uVar3;
          }
          local_d8 = hex_nodes[2];
          new_cell = hex_nodes[3];
          pri_nodes[0] = local_b8;
          pri_nodes[1] = hex_nodes[5];
          pri_nodes[2] = hex_nodes[4];
          pri_nodes[3] = hex_nodes[1];
          uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c"
                   ,0x15f,"ref_shard_split",(ulong)uVar3,"add hex_pri 2");
            return uVar3;
          }
        }
      }
      else {
        uVar3 = ref_cell_remove(ref_cell,local_44);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x13d,"ref_shard_split",(ulong)uVar3,"remove hex");
          return uVar3;
        }
        local_d8 = local_b4;
        new_cell = local_b8;
        pri_nodes[0] = hex_nodes[2];
        pri_nodes[1] = hex_nodes[0];
        pri_nodes[2] = hex_nodes[1];
        pri_nodes[3] = hex_nodes[5];
        uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x144,"ref_shard_split",(ulong)uVar3,"add hex pri 1");
          return uVar3;
        }
        local_d8 = local_b4;
        new_cell = hex_nodes[2];
        pri_nodes[0] = hex_nodes[3];
        pri_nodes[1] = hex_nodes[0];
        pri_nodes[2] = hex_nodes[5];
        pri_nodes[3] = hex_nodes[4];
        uVar3 = ref_cell_add(ref_cell_00,&local_d8,&local_dc);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_shard.c",
                 0x14b,"ref_shard_split",(ulong)uVar3,"add hex_pri 2");
          return uVar3;
        }
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_shard_split(REF_SHARD ref_shard) {
  REF_GRID ref_grid;
  REF_CELL hex, pri, tri, qua;
  REF_INT cell, hex_nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT pri_nodes[6], new_cell;
  REF_INT tri_nodes[4], qua_nodes[5];
  REF_BOOL marked;

  ref_grid = ref_shard_grid(ref_shard);
  hex = ref_grid_hex(ref_grid);
  pri = ref_grid_pri(ref_grid);
  tri = ref_grid_tri(ref_grid);
  qua = ref_grid_qua(ref_grid);

  each_ref_cell_valid_cell_with_nodes(qua, cell, qua_nodes) {
    RSS(ref_shard_marked(ref_shard, qua_nodes[0], qua_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[2];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
    RSS(ref_shard_marked(ref_shard, qua_nodes[1], qua_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(qua, cell), "remove qua");
      tri_nodes[0] = qua_nodes[0];
      tri_nodes[1] = qua_nodes[1];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
      tri_nodes[0] = qua_nodes[1];
      tri_nodes[1] = qua_nodes[2];
      tri_nodes[2] = qua_nodes[3];
      tri_nodes[3] = qua_nodes[4]; /* bound id */
      RSS(ref_cell_add(tri, tri_nodes, &new_cell), "add tri");
    }
  }

  each_ref_cell_valid_cell_with_nodes(hex, cell, hex_nodes) {
    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[4], &marked),
        "1-4");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[0];
      pri_nodes[2] = hex_nodes[4];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[3];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[4];
      pri_nodes[2] = hex_nodes[5];
      pri_nodes[3] = hex_nodes[2];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[5], &marked),
        "0-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[1];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[2];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[4];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[0];
      pri_nodes[3] = hex_nodes[7];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[6], &marked),
        "1-6");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[6];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[7];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
    RSS(ref_shard_marked(ref_shard, hex_nodes[2], hex_nodes[5], &marked),
        "2-5");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[0];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[3];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[2];
      pri_nodes[1] = hex_nodes[5];
      pri_nodes[2] = hex_nodes[6];
      pri_nodes[3] = hex_nodes[3];
      pri_nodes[4] = hex_nodes[4];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[0], hex_nodes[2], &marked),
        "0-2");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[2];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[6];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }

    RSS(ref_shard_marked(ref_shard, hex_nodes[1], hex_nodes[3], &marked),
        "1-3");
    if (marked) {
      RSS(ref_cell_remove(hex, cell), "remove hex");
      pri_nodes[0] = hex_nodes[0];
      pri_nodes[1] = hex_nodes[1];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[4];
      pri_nodes[4] = hex_nodes[5];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex pri 1");
      pri_nodes[0] = hex_nodes[1];
      pri_nodes[1] = hex_nodes[2];
      pri_nodes[2] = hex_nodes[3];
      pri_nodes[3] = hex_nodes[5];
      pri_nodes[4] = hex_nodes[6];
      pri_nodes[5] = hex_nodes[7];
      RSS(ref_cell_add(pri, pri_nodes, &new_cell), "add hex_pri 2");
      continue;
    }
  }

  return REF_SUCCESS;
}